

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirDependsCommand.h
# Opt level: O0

void __thiscall cmSubdirDependsCommand::~cmSubdirDependsCommand(cmSubdirDependsCommand *this)

{
  cmSubdirDependsCommand *this_local;
  
  ~cmSubdirDependsCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmSubdirDependsCommand; }